

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_> *
Jinx::Impl::GetUtf8CharsByRange
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
           *__return_storage_ptr__,String *source,pair<long,_long> *range)

{
  char *pcVar1;
  char *utf8Str;
  size_t sVar2;
  String out;
  
  if (range->second < range->first) {
    LogWriteLine(Error,"First range index is greater than second");
  }
  else {
    pcVar1 = GetUtf8CstrByIndex(source,range->first);
    utf8Str = GetUtf8CstrByIndex(source,range->second);
    if (pcVar1 != (char *)0x0 && utf8Str != (char *)0x0) {
      sVar2 = GetUtf8CharSize(utf8Str);
      out._M_dataplus._M_p = (pointer)&out.field_2;
      out._M_string_length = 0;
      out.field_2._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
                (&out,(range->second - range->first) + 1);
      for (; pcVar1 < utf8Str + sVar2; pcVar1 = pcVar1 + 1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::push_back
                  (&out,*pcVar1);
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true>
                (__return_storage_ptr__,&out);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&out);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  ._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

inline_t std::optional<String> GetUtf8CharsByRange(const String & source, const std::pair<int64_t, int64_t> & range)
	{
		if (range.first > range.second)
		{
			LogWriteLine(LogLevel::Error, "First range index is greater than second");
			return std::optional<String>();
		}
		const char * srcCurr = GetUtf8CstrByIndex(source, range.first);
		const char * srcEnd = GetUtf8CstrByIndex(source, range.second);
		if (srcCurr == nullptr || srcEnd == nullptr)
			return std::optional<String>();
		srcEnd += GetUtf8CharSize(srcEnd);
		String out;
		out.reserve(range.second - range.first + 1);
		while (srcCurr < srcEnd)
		{
			out += *srcCurr;
			++srcCurr;
		}
		return out;
	}